

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O0

int base58_decode(char *base58,size_t base58_len,uchar *bytes_out,size_t *len)

{
  beint32_t bVar1;
  uchar *puVar2;
  ulong uVar3;
  long lVar4;
  size_t __n;
  bool bVar5;
  uint64_t mult;
  uchar byte;
  uint32_t *puStack_278;
  int ret;
  uchar *cp;
  size_t i;
  size_t cp_len;
  size_t ones;
  size_t bn_words;
  uint32_t *bn_p;
  uint32_t *top_word;
  uint32_t *bn;
  uint32_t bn_buf [128];
  size_t *len_local;
  uchar *bytes_out_local;
  size_t base58_len_local;
  char *base58_local;
  
  top_word = (uint32_t *)&bn;
  mult._4_4_ = -2;
  if ((base58 == (char *)0x0) || (base58_len == 0)) {
    base58_local._4_4_ = -2;
  }
  else {
    cp_len = 0;
    while( true ) {
      bVar5 = false;
      if (cp_len < base58_len) {
        bVar5 = base58[cp_len] == '1';
      }
      if (!bVar5) break;
      cp_len = cp_len + 1;
    }
    puVar2 = (uchar *)(base58_len - cp_len);
    if (puVar2 == (uchar *)0x0) {
      if ((bytes_out != (uchar *)0x0) && (cp_len <= *len)) {
        memset(bytes_out,0,cp_len);
      }
      *len = cp_len;
      base58_local._4_4_ = 0;
    }
    else {
      uVar3 = ((long)puVar2 * 6 + 7U >> 3) + 3 >> 2;
      if ((uVar3 < 0x81) ||
         (top_word = (uint32_t *)wally_malloc(uVar3 << 2), top_word != (uint32_t *)0x0)) {
        bn_p = top_word + (uVar3 - 1);
        *bn_p = 0;
        for (cp = (uchar *)0x0; cp < puVar2; cp = cp + 1) {
          mult._3_1_ = ""[(byte)(base58 + cp_len)[(long)cp]] - 1;
          if (""[(byte)(base58 + cp_len)[(long)cp]] == '\0') goto LAB_00163fe6;
          bn_words = (size_t)(top_word + uVar3);
          do {
            bn_words = bn_words + -4;
            if (bn_words < bn_p) goto LAB_00163ea5;
            lVar4 = (ulong)*(uint *)bn_words * 0x3a + (ulong)mult._3_1_;
            *(int *)bn_words = (int)lVar4;
            mult._3_1_ = (byte)((ulong)lVar4 >> 0x20);
          } while ((mult._3_1_ == 0) || ((uint32_t *)bn_words != bn_p));
          bn_p[-1] = (uint)mult._3_1_;
          bn_p = bn_p + -1;
LAB_00163ea5:
        }
        for (bn_words = (size_t)bn_p; bn_words < top_word + uVar3; bn_words = bn_words + 4) {
          bVar1 = cpu_to_be32(*(uint32_t *)bn_words);
          *(beint32_t *)bn_words = bVar1;
        }
        for (puStack_278 = bn_p; (char)*puStack_278 == '\0';
            puStack_278 = (uint32_t *)((long)puStack_278 + 1)) {
        }
        __n = (long)top_word + (uVar3 * 4 - (long)puStack_278);
        if ((bytes_out != (uchar *)0x0) && (cp_len + __n <= *len)) {
          memset(bytes_out,0,cp_len);
          memcpy(bytes_out + cp_len,puStack_278,__n);
        }
        *len = cp_len + __n;
        mult._4_4_ = 0;
      }
      else {
        mult._4_4_ = -3;
      }
LAB_00163fe6:
      if ((top_word != (uint32_t *)0x0) &&
         (wally_clear(top_word,uVar3 << 2), (uint32_t **)top_word != &bn)) {
        wally_free(top_word);
      }
      base58_local._4_4_ = mult._4_4_;
    }
  }
  return base58_local._4_4_;
}

Assistant:

static int base58_decode(const char *base58, size_t base58_len,
                         unsigned char *bytes_out, size_t *len)
{
    uint32_t bn_buf[BIGNUM_WORDS];
    uint32_t *bn = bn_buf, *top_word, *bn_p;
    size_t bn_words = 0, ones, cp_len, i;
    unsigned char *cp;
    int ret = WALLY_EINVAL;

    if (!base58 || !base58_len)
        return WALLY_EINVAL; /* Empty string can't be decoded or represented */

    /* Process leading '1's */
    for (ones = 0; ones < base58_len && base58[ones] == '1'; ++ones)
        ; /* no-op*/

    if (!(base58_len -= ones)) {
        if (bytes_out && ones <= *len)
            memset(bytes_out, 0, ones);
        *len = ones;
        return WALLY_OK; /* String of all '1's */
    }
    base58 += ones; /* Skip over leading '1's */

    /* Take 6 bits to store each 58 bit number, rounded up to the next byte,
     * then round that up to a uint32_t word boundary. */
    bn_words = ((base58_len * 6 + 7) / 8 + 3) / 4;

    /* Allocate our bignum buffer if it won't fit on the stack */
    if (bn_words > BIGNUM_WORDS)
        if (!(bn = wally_malloc(bn_words * sizeof(*bn)))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

    /* Iterate through the characters adding them to our bignum. We keep
     * track of the current top word to avoid iterating over words that
     * we know are zero. */
    top_word = bn + bn_words - 1;
    *top_word = 0;

    for (i = 0; i < base58_len; ++i) {
        unsigned char byte = base58_to_byte[((unsigned char *)base58)[i]];
        if (!byte--)
            goto cleanup; /* Invalid char */

        for (bn_p = bn + bn_words - 1; bn_p >= top_word; --bn_p) {
            uint64_t mult = *bn_p * 58ull + byte;
            *bn_p = mult & 0xffffffff;
            byte = (mult >> 32) & 0xff;
            if (byte && bn_p == top_word) {
                *--top_word = byte; /* Increase bignum size */
                break;
            }
        }
    }

    /* We have our bignum stored from top_word to bn + bn_words - 1. Convert
     * its words to big-endian so we can simply memcpy it to bytes_out. */
    for (bn_p = top_word; bn_p < bn + bn_words; ++bn_p)
        *bn_p = cpu_to_be32(*bn_p); /* No-op on big-endian machines */

    for (cp = (unsigned char *)top_word; !*cp; ++cp)
        ; /* Skip leading zero bytes in our bignum */

    /* Copy the result if it fits, cleanup and return */
    cp_len = (unsigned char *)(bn + bn_words) - cp;

    if (bytes_out && ones + cp_len <= *len) {
        memset(bytes_out, 0, ones);
        memcpy(bytes_out + ones, cp, cp_len);
    }

    *len = ones + cp_len;
    ret = WALLY_OK;

cleanup:
    if (bn) {
        wally_clear(bn, bn_words * sizeof(*bn));
        if (bn != bn_buf)
            wally_free(bn);
    }
    return ret;
}